

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int tlp_mr_data_length(tlp_mr_hdr *mh)

{
  uint16_t uVar1;
  long in_RDI;
  uint32_t len;
  int n;
  int local_10;
  int local_c;
  
  uVar1 = ntohs(*(uint16_t *)(in_RDI + 2));
  local_10 = (uVar1 & 0x3ff) << 2;
  if (((*(byte *)(in_RDI + 7) & 0xf) != 0) && ((*(byte *)(in_RDI + 7) & 0xf) != 0xf)) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      if (((uint)(*(byte *)(in_RDI + 7) & 0xf) & 1 << ((byte)local_c & 0x1f)) == 0) {
        local_10 = local_10 + -1;
      }
    }
  }
  if ((*(byte *)(in_RDI + 7) >> 4 != 0) && (*(byte *)(in_RDI + 7) >> 4 != 0xf)) {
    local_c = 0;
    while ((local_c < 4 && (((uint)(*(byte *)(in_RDI + 7) >> 4) & 8 >> ((byte)local_c & 0x1f)) == 0)
           )) {
      local_10 = local_10 + -1;
      local_c = local_c + 1;
    }
  }
  return local_10;
}

Assistant:

int tlp_mr_data_length(struct tlp_mr_hdr *mh)
{
	int n;
	uint32_t len;

	len = tlp_length(mh->tlp.falen) << 2;

	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				len--;
			}
		}
	}

	if (mh->lstdw && mh->lstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->lstdw & (0x8 >> n)) == 0) {
				len--;
			} else
				break;
		}
	}

	return len;
}